

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

int run_test_we_get_signals_mixed(void)

{
  int iVar1;
  uv_loop_t *loop;
  ulong *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc [4];
  ulong local_2e8;
  timer_ctx local_2e0;
  signal_ctx local_258;
  signal_ctx local_1d0;
  signal_ctx local_148;
  signal_ctx local_c0;
  
  loop = (uv_loop_t *)uv_default_loop();
  start_timer(loop,0x11,&local_2e0);
  start_watcher(loop,0x11,&local_258,1);
  start_watcher(loop,0x11,&local_1d0,1);
  local_258.stop_or_close = CLOSE;
  local_1d0.stop_or_close = CLOSE;
  iVar1 = uv_run(loop,0);
  local_2e8 = (ulong)iVar1;
  if (local_2e8 == 0) {
    local_2e8 = (ulong)local_2e0.ncalls;
    if (local_2e8 != 10) goto LAB_001be0f0;
    local_2e8 = 1;
    if (local_258.ncalls != 1) goto LAB_001be0ff;
    local_2e8 = 1;
    if (local_1d0.ncalls != 1) goto LAB_001be10e;
    start_timer(loop,0x11,&local_2e0);
    start_watcher(loop,0x11,&local_258,1);
    start_watcher(loop,0x11,&local_1d0,1);
    local_258.stop_or_close = CLOSE;
    local_1d0.stop_or_close = CLOSE;
    start_watcher(loop,0x11,&local_148,0);
    uv_close(&local_148.handle,0);
    iVar1 = uv_run(loop,0);
    local_2e8 = (ulong)iVar1;
    if (local_2e8 != 0) goto LAB_001be11d;
    local_2e8 = (ulong)local_2e0.ncalls;
    if (local_2e8 != 10) goto LAB_001be12c;
    local_2e8 = 1;
    if (local_258.ncalls != 1) goto LAB_001be13b;
    local_2e8 = 1;
    if (local_1d0.ncalls != 1) goto LAB_001be14a;
    local_2e8 = (ulong)local_148.ncalls;
    if (local_2e8 != 0) goto LAB_001be159;
    start_timer(loop,0x11,&local_2e0);
    start_watcher(loop,0x11,&local_258,0);
    start_watcher(loop,0x11,&local_1d0,0);
    local_258.stop_or_close = CLOSE;
    local_1d0.stop_or_close = CLOSE;
    start_watcher(loop,0x11,&local_148,1);
    uv_close(&local_148.handle,0);
    iVar1 = uv_run(loop,0);
    local_2e8 = (ulong)iVar1;
    if (local_2e8 != 0) goto LAB_001be168;
    local_2e8 = (ulong)local_2e0.ncalls;
    if (local_2e8 != 10) goto LAB_001be177;
    local_2e8 = (ulong)local_258.ncalls;
    if (local_2e8 != 10) goto LAB_001be186;
    local_2e8 = (ulong)local_1d0.ncalls;
    if (local_2e8 != 10) goto LAB_001be195;
    local_2e8 = (ulong)local_148.ncalls;
    if (local_2e8 != 0) goto LAB_001be1a4;
    start_timer(loop,0x11,&local_2e0);
    start_watcher(loop,0x11,&local_258,0);
    start_watcher(loop,0x11,&local_1d0,0);
    start_watcher(loop,0x11,&local_148,1);
    start_watcher(loop,0x11,&local_c0,1);
    local_148.stop_or_close = CLOSE;
    local_c0.stop_or_close = CLOSE;
    uv_close(&local_258.handle,0);
    uv_close(&local_1d0.handle,0);
    iVar1 = uv_run(loop,0);
    local_2e8 = (ulong)iVar1;
    if (local_2e8 != 0) goto LAB_001be1b3;
    local_2e8 = (ulong)local_2e0.ncalls;
    if (local_2e8 != 10) goto LAB_001be1c2;
    local_2e8 = (ulong)local_258.ncalls;
    if (local_2e8 != 0) goto LAB_001be1d1;
    local_2e8 = (ulong)local_1d0.ncalls;
    if (local_2e8 != 0) goto LAB_001be1e0;
    local_2e8 = 1;
    if (local_148.ncalls != 1) goto LAB_001be1ef;
    local_2e8 = 1;
    start_timer(loop,0x11,&local_2e0);
    start_watcher(loop,0x11,&local_258,0);
    start_watcher(loop,0x11,&local_1d0,1);
    start_watcher(loop,0x11,&local_148,0);
    start_watcher(loop,0x11,&local_c0,0);
    local_c0.stop_or_close = CLOSE;
    uv_close(&local_258.handle,0);
    uv_close(&local_148.handle,0);
    iVar1 = uv_run(loop,0);
    local_2e8 = (ulong)iVar1;
    if (local_2e8 != 0) goto LAB_001be20d;
    local_2e8 = (ulong)local_2e0.ncalls;
    if (local_2e8 != 10) goto LAB_001be21c;
    local_2e8 = (ulong)local_258.ncalls;
    if (local_2e8 != 0) goto LAB_001be22b;
    local_2e8 = 1;
    if (local_1d0.ncalls != 1) goto LAB_001be23a;
    local_2e8 = (ulong)local_148.ncalls;
    if (local_2e8 != 0) goto LAB_001be249;
    local_2e8 = (ulong)local_c0.ncalls;
    if (local_2e8 == 10) {
      uv_walk(loop,close_walk_cb,0);
      uv_run(loop,0);
      local_2e8 = 0;
      iVar1 = uv_loop_close(loop);
      if (local_2e8 == (long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001be267;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001be0f0:
    run_test_we_get_signals_mixed_cold_2();
LAB_001be0ff:
    run_test_we_get_signals_mixed_cold_3();
LAB_001be10e:
    run_test_we_get_signals_mixed_cold_4();
LAB_001be11d:
    run_test_we_get_signals_mixed_cold_5();
LAB_001be12c:
    run_test_we_get_signals_mixed_cold_6();
LAB_001be13b:
    run_test_we_get_signals_mixed_cold_7();
LAB_001be14a:
    run_test_we_get_signals_mixed_cold_8();
LAB_001be159:
    run_test_we_get_signals_mixed_cold_9();
LAB_001be168:
    run_test_we_get_signals_mixed_cold_10();
LAB_001be177:
    run_test_we_get_signals_mixed_cold_11();
LAB_001be186:
    run_test_we_get_signals_mixed_cold_12();
LAB_001be195:
    run_test_we_get_signals_mixed_cold_13();
LAB_001be1a4:
    run_test_we_get_signals_mixed_cold_14();
LAB_001be1b3:
    run_test_we_get_signals_mixed_cold_15();
LAB_001be1c2:
    run_test_we_get_signals_mixed_cold_16();
LAB_001be1d1:
    run_test_we_get_signals_mixed_cold_17();
LAB_001be1e0:
    run_test_we_get_signals_mixed_cold_18();
LAB_001be1ef:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001be20d:
    run_test_we_get_signals_mixed_cold_21();
LAB_001be21c:
    run_test_we_get_signals_mixed_cold_22();
LAB_001be22b:
    run_test_we_get_signals_mixed_cold_23();
LAB_001be23a:
    run_test_we_get_signals_mixed_cold_24();
LAB_001be249:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001be267:
  puVar2 = &local_2e8;
  run_test_we_get_signals_mixed_cold_27();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar2,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(we_get_signals_mixed) {
  struct signal_ctx sc[4];
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* 2 one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);

  /* 2 one-shot, 1 normal then remove normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 1 one-shot then remove one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc[0].ncalls, NSIGNALS);
  ASSERT_EQ(sc[1].ncalls, NSIGNALS);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 2 one-shot then remove 2 normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  start_watcher(loop, SIGCHLD, sc + 3, 1);
  sc[2].stop_or_close = CLOSE;
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[1]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_OK(sc[1].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);

  /* 1 normal, 1 one-shot, 2 normal then remove 1st normal, 2nd normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  start_watcher(loop, SIGCHLD, sc + 3, 0);
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);
  ASSERT_EQ(sc[3].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}